

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressStream(ZSTD_CStream *zcs,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  ZSTDMT_CCtx *pZVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar3 = ZSTD_compressStream2(zcs,output,input,ZSTD_e_continue);
  if (sVar3 < 0xffffffffffffff89) {
    if ((zcs->appliedParams).nbWorkers < 1) {
      sVar3 = zcs->inBuffTarget - zcs->inBuffPos;
      if (sVar3 == 0) {
        sVar3 = zcs->blockSize;
      }
    }
    else {
      pZVar1 = zcs->mtctx;
      if (pZVar1 == (ZSTDMT_CCtx *)0x0) {
        __assert_fail("cctx->mtctx != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x398f,"size_t ZSTD_nextInputSizeHint_MTorST(const ZSTD_CCtx *)");
      }
      sVar2 = (pZVar1->inBuff).filled;
      sVar3 = 0;
      if (pZVar1->targetSectionSize != sVar2) {
        sVar3 = sVar2;
      }
      sVar3 = pZVar1->targetSectionSize - sVar3;
    }
  }
  return sVar3;
}

Assistant:

size_t ZSTD_compressStream(ZSTD_CStream* zcs, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    FORWARD_IF_ERROR( ZSTD_compressStream2(zcs, output, input, ZSTD_e_continue) );
    return ZSTD_nextInputSizeHint_MTorST(zcs);
}